

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

bool WindowedKeyTest<Blob<32>,unsigned_long>
               (hashfunc<unsigned_long> hash,int windowbits,bool testCollision,bool testDistribution
               ,bool drawDiagram)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  int i;
  uint nbH;
  ulong uVar4;
  uint c;
  double dVar5;
  Blob<32> local_50;
  Blob<32> key;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  
  nbH = 1 << (windowbits & 0x1fU);
  while( true ) {
    dVar5 = EstimateNbCollisions(nbH,0x40);
    if ((0.5 <= dVar5) || (0x18 < windowbits)) break;
    dVar5 = log2((double)(int)nbH + (double)(int)nbH);
    if ((int)dVar5 < 0) break;
    nbH = nbH * 2;
    dVar5 = log2((double)(int)nbH);
    windowbits = (int)dVar5;
  }
  hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&hashes,(long)(int)nbH);
  printf("Keyset \'Window\' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",0x20,
         (ulong)(uint)windowbits);
  bVar2 = true;
  for (c = 0; c != 0x21; c = c + 1) {
    Blob<32>::Blob(&key);
    lVar3 = 0;
    for (uVar4 = 0; (~((int)nbH >> 0x1f) & nbH) != uVar4; uVar4 = uVar4 + 1) {
      Blob<32>::Blob(&local_50,(int)uVar4);
      Blob<32>::operator=(&key,&local_50);
      lrot32(&key,4,c);
      (*hash.m_hash)(&key,4,0,(void *)((long)hashes.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar3));
      lVar3 = lVar3 + 8;
    }
    printf("Window at %3d - ",(ulong)c);
    bVar1 = TestHashList<unsigned_long>
                      (&hashes,drawDiagram,testCollision,testDistribution,false,false);
    bVar2 = (bool)(bVar2 & bVar1);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return bVar2;
}

Assistant:

bool WindowedKeyTest ( hashfunc<hashtype> hash, int windowbits,
                       bool testCollision, bool testDistribution, bool drawDiagram )
{
  const int keybits = sizeof(keytype) * 8;
  // calc keycount to expect min. 0.5 collisions: EstimateNbCollisions, except for 64++bit.
  // there limit to 2^25 = 33554432 keys
  int keycount = 1 << windowbits;
  while (EstimateNbCollisions(keycount, sizeof(hashtype) * 8) < 0.5 && windowbits < 25) {
    if ((int)log2(2.0 * keycount) < 0) // overflow
      break;
    keycount *= 2;
    windowbits = (int)log2(1.0 * keycount);
    //printf (" enlarge windowbits to %d (%d keys)\n", windowbits, keycount);
    //fflush (NULL);
  }

  std::vector<hashtype> hashes;
  hashes.resize(keycount);

  bool result = true;
  int testcount = keybits;

  printf("Keyset 'Window' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",
         keybits,windowbits,testcount,keycount);

  for(int j = 0; j <= testcount; j++)
  {
    int minbit = j;
    keytype key;

    for(int i = 0; i < keycount; i++)
    {
      key = i;
      //key = key << minbit;
      lrot(&key,sizeof(keytype),minbit);
      hash(&key,sizeof(keytype),0,&hashes[i]);
    }

    printf("Window at %3d - ",j);
    result &= TestHashList(hashes, drawDiagram, testCollision, testDistribution,
                           /* do not test high/low bits (to not clobber the screen) */
                           false, false);
    //printf("\n");
  }

  return result;
}